

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O0

void __thiscall dynamicgraph::SignalBase<int>::~SignalBase(SignalBase<int> *this)

{
  SignalBase<int> *this_local;
  
  ~SignalBase(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~SignalBase() {}